

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.h
# Opt level: O2

void __thiscall
agge::tests::mocks::renderer_adapter<unsigned_short>::operator()
          (renderer_adapter<unsigned_short> *this,int x,count_t length,cover_type_conflict1 *covers)

{
  render_log_entry e;
  value_type local_50;
  undefined1 local_40 [32];
  
  local_40._0_4_ = x;
  std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_short_const*>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)(local_40 + 8),covers,
             covers + length,(allocator_type *)&local_50);
  std::
  vector<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry,_std::allocator<agge::tests::mocks::renderer_adapter<unsigned_short>::render_log_entry>_>
  ::push_back(&this->render_log,(value_type *)local_40);
  local_50.first = covers;
  local_50.second = length;
  std::
  vector<std::pair<const_unsigned_short_*,_unsigned_int>,_std::allocator<std::pair<const_unsigned_short_*,_unsigned_int>_>_>
  ::push_back(&this->raw_render_log,&local_50);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)(local_40 + 8));
  return;
}

Assistant:

void operator ()(int x, count_t length, const cover_type *covers)
				{
					using namespace std;

					render_log_entry e = { x, vector<cover_type>(covers, covers + length) };
					render_log.push_back(e);
					raw_render_log.push_back(make_pair(covers, length));
				}